

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGTexture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmXe_LPGTextureCalc::FillTexPlanar
          (GmmXe_LPGTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint32_t uVar1;
  uint uVar2;
  GMM_GFX_SIZE_T GVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  sbyte sVar23;
  bool bVar24;
  uint32_t uVar25;
  int iVar26;
  int iVar27;
  GMM_PLATFORM_INFO *pGVar28;
  WA_TABLE *pWVar29;
  GMM_PLATFORM_INFO *pGVar30;
  SKU_FEATURE_TABLE *pSVar31;
  GMM_GFX_SIZE_T GVar32;
  uint32_t local_104;
  uint32_t local_f8;
  uint32_t local_ec;
  uint local_e0;
  uint local_dc;
  int local_d0;
  uint local_c8;
  int local_c4;
  uint32_t local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  uint32_t local_b0;
  uint local_ac;
  int64_t LargeSize;
  GMM_GFX_SIZE_T ElementSizeBytes;
  uint32_t BaseTileWidth;
  uint32_t TileHeight_1;
  uint32_t TileCols;
  uint32_t TileWidth;
  uint32_t TileHeight;
  uint32_t LShift;
  uint32_t YSizeForUVPurposesDimensionalAlignment;
  uint32_t YSizeForUVPurposes;
  uint32_t YVSizeRShift;
  uint32_t UVSize;
  uint32_t YSize;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t AlignedWidth;
  uint32_t BitsPerPixel;
  GMM_STATUS GStack_3c;
  bool UVPacked;
  GMM_STATUS Status;
  uint32_t AdjustedVHeight;
  uint32_t VHeight;
  uint32_t YHeight;
  uint32_t Height;
  uint32_t WidthBytesPhysical;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmXe_LPGTextureCalc *this_local;
  
  bVar22 = false;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    _Height = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar28 = GmmGetPlatformInfo((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                                 super_GmmTextureCalc.pGmmLibContext);
    uVar1 = pRestrictions_local->RenderPitchAlignment;
    GVar3 = pRestrictions_local->MinAllocationSize;
    uVar4._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar4._4_4_ = pRestrictions_local->MinPitch;
    if ((uVar4 >> 0x29 & 1) == 0) {
      *(undefined4 *)&pRestrictions_local[4].MinWidth = 0;
    }
    else {
      *(undefined4 *)&pRestrictions_local[4].MinWidth = 2;
    }
    YHeight = (int)GVar3 * uVar1 >> 3;
    Status = GMM_SUCCESS;
    AdjustedVHeight = pRestrictions_local->MinHeight;
    switch(pRestrictions_local->PitchAlignment) {
    case 0x13c:
    case 0x168:
      if ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x13 & 1) == 0) {
        AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
        *(undefined4 *)&pRestrictions_local[4].MaxPitch = 3;
      }
      else {
        *(undefined4 *)&pRestrictions_local[4].MaxPitch = 3;
      }
      VHeight = AdjustedVHeight * 3;
      Status = AdjustedVHeight;
      break;
    default:
      return GMM_ERROR;
    case 0x14f:
    case 0x150:
    case 0x174:
    case 0x175:
      sVar23 = 4;
      if (pRestrictions_local->PitchAlignment != 0x175) {
        sVar23 = 2;
      }
      iVar26 = 4;
      if (pRestrictions_local->PitchAlignment != 0x175) {
        iVar26 = 2;
      }
      iVar26 = (((YHeight + iVar26 + -1) - (YHeight + iVar26 + -1 & iVar26 - 1U)) *
                ((AdjustedVHeight + iVar26 + -1) - (AdjustedVHeight + iVar26 + -1 & iVar26 - 1U)) >>
               sVar23) * 2;
      if (YHeight == 0) {
        local_ac = YHeight * AdjustedVHeight + iVar26;
      }
      else {
        local_ac = (YHeight * AdjustedVHeight + iVar26 + (YHeight - 1)) / YHeight;
      }
      VHeight = local_ac;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffdfffffffff;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffff7ffffffff;
      *(ulong *)&pRestrictions_local->field_0x14 =
           *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffff7ffff | 0x80000;
      *(undefined4 *)&pRestrictions_local[4].MaxPitch = 1;
      pSVar31 = Context::GetSkuTable
                          ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                           super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                           pGmmLibContext);
      if ((*(ushort *)&pSVar31->field_0 >> 6 & 1) == 0) {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffefffffffffff;
      }
      else {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffbfffffffff;
      }
      pSVar31 = Context::GetSkuTable
                          ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                           super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                           pGmmLibContext);
      if ((*(ushort *)&pSVar31->field_0 >> 6 & 1) == 0) {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xfffff7ffffffffff;
      }
      else {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffefffffffff;
      }
      break;
    case 0x151:
    case 0x153:
    case 0x158:
    case 0x15a:
      Status = ((AdjustedVHeight + GMM_ERROR >> 1) + 0xf) -
               ((AdjustedVHeight + GMM_ERROR >> 1) + 0xf & 0xf);
      AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      VHeight = AdjustedVHeight + Status * 2;
      *(undefined4 *)&pRestrictions_local[4].MaxPitch = 3;
      break;
    case 0x152:
    case 0x154:
      AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      Status = AdjustedVHeight + 1 >> 1;
      YHeight = (YHeight + 1) - (YHeight + 1 & 1);
      VHeight = AdjustedVHeight + Status;
      bVar22 = true;
      *(undefined4 *)&pRestrictions_local[4].MaxPitch = 2;
      break;
    case 0x156:
    case 0x159:
    case 0x15b:
      Status = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      VHeight = Status * 3;
      *(undefined4 *)&pRestrictions_local[4].MaxPitch = 3;
      AdjustedVHeight = Status;
      break;
    case 0x157:
      Status = ((AdjustedVHeight + GMM_OUT_OF_MEMORY >> 2) + 0xf) -
               ((AdjustedVHeight + GMM_OUT_OF_MEMORY >> 2) + 0xf & 0xf);
      AdjustedVHeight = (AdjustedVHeight + 0xf) - (AdjustedVHeight + 0xf & 0xf);
      VHeight = AdjustedVHeight + Status * 2;
      *(undefined4 *)&pRestrictions_local[4].MaxPitch = 3;
      break;
    case 0x15c:
    case 0x15d:
    case 0x15e:
    case 0x160:
    case 0x161:
    case 0x162:
    case 0x163:
    case 0x180:
      if ((((pRestrictions_local->PitchAlignment == 0x15d) ||
           (pRestrictions_local->PitchAlignment == 0x15e)) ||
          (pRestrictions_local->PitchAlignment == 0x160)) ||
         ((pRestrictions_local->PitchAlignment == 0x161 ||
          (pRestrictions_local->PitchAlignment == 0x162)))) {
        Status = AdjustedVHeight + GMM_ERROR >> 1;
        VHeight = AdjustedVHeight + Status;
      }
      else {
        VHeight = AdjustedVHeight * 2;
        Status = AdjustedVHeight;
      }
      if ((((pRestrictions_local->PitchAlignment == 0x15d) ||
           (pRestrictions_local->PitchAlignment == 0x15e)) ||
          ((pRestrictions_local->PitchAlignment == 0x160 ||
           (((pRestrictions_local->PitchAlignment == 0x161 ||
             (pRestrictions_local->PitchAlignment == 0x162)) ||
            (pRestrictions_local->PitchAlignment == 0x163)))))) ||
         (pRestrictions_local->PitchAlignment == 0x180)) {
        YHeight = (YHeight + 1) - (YHeight + 1 & 1);
        *(undefined4 *)&pRestrictions_local[4].MaxPitch = 2;
      }
      else {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffdfffffffff;
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffff7ffffffff;
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffff7ffff | 0x80000;
        pSVar31 = Context::GetSkuTable
                            ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                             super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc
                             .pGmmLibContext);
        if ((*(ushort *)&pSVar31->field_0 >> 6 & 1) == 0) {
          *(ulong *)&pRestrictions_local->field_0x14 =
               *(ulong *)&pRestrictions_local->field_0x14 & 0xffffefffffffffff;
        }
        else {
          *(ulong *)&pRestrictions_local->field_0x14 =
               *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffbfffffffff;
        }
        pSVar31 = Context::GetSkuTable
                            ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                             super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc
                             .pGmmLibContext);
        if ((*(ushort *)&pSVar31->field_0 >> 6 & 1) == 0) {
          *(ulong *)&pRestrictions_local->field_0x14 =
               *(ulong *)&pRestrictions_local->field_0x14 & 0xfffff7ffffffffff;
        }
        else {
          *(ulong *)&pRestrictions_local->field_0x14 =
               *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffefffffffff;
        }
      }
      bVar22 = true;
    }
    VHeight = (VHeight + 1) - (VHeight + 1 & 1);
    GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    uVar5._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar5._4_4_ = pRestrictions_local->MinPitch;
    if ((((uVar5 >> 0x10 & 1) != 0) &&
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) == 0)) &&
       (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2b & 1) == 0 &&
        (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0 &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) == 0)))))) {
      uVar6._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar6._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar6 & 0xfffffffffffeffff);
      pRestrictions_local->MinPitch = (int)((uVar6 & 0xfffffffffffeffff) >> 0x20);
    }
    uVar7._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar7._4_4_ = pRestrictions_local->MinPitch;
    if ((((((uVar7 >> 1 & 1) != 0) &&
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) == 0)) &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2b & 1) == 0)) &&
        (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0 &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) == 0)))) &&
       ((uVar8._0_4_ = pRestrictions_local->LockPitchAlignment,
        uVar8._4_4_ = pRestrictions_local->MinPitch, (uVar8 >> 0x29 & 1) == 0 ||
        (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x24 & 1) == 0 &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2b & 1) == 0)))))) {
      uVar9._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar9._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar9 & 0xfffffffffffeffff);
      pRestrictions_local->MinPitch = (int)((uVar9 & 0xfffffffffffeffff) >> 0x20);
      uVar10._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar10._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar10 & 0xfffffffffffffffd);
      pRestrictions_local->MinPitch = (int)((uVar10 & 0xfffffffffffffffd) >> 0x20);
      uVar11._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar11._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar11 & 0xffffffdfffffffff);
      pRestrictions_local->MinPitch = (int)((uVar11 & 0xffffffdfffffffff) >> 0x20);
      uVar12._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar12._4_4_ = pRestrictions_local->MinPitch;
      pRestrictions_local->LockPitchAlignment = (int)(uVar12 & 0xfffffdffffffffff);
      pRestrictions_local->MinPitch = (int)((uVar12 & 0xfffffdffffffffff) >> 0x20);
    }
    if (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x13 & 1) != 0) &&
       ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 4 & 1) == 0)) {
      if (_Height->LockPitchAlignment < 0x41) {
        local_b0 = 0x40;
      }
      else {
        local_b0 = _Height->LockPitchAlignment;
      }
      _Height->LockPitchAlignment = local_b0;
      if (_Height->MinPitch < 0x41) {
        local_b4 = 0x40;
      }
      else {
        local_b4 = _Height->MinPitch;
      }
      _Height->MinPitch = local_b4;
      if (_Height->PitchAlignment < 0x41) {
        local_b8 = 0x40;
      }
      else {
        local_b8 = _Height->PitchAlignment;
      }
      _Height->PitchAlignment = local_b8;
      if (_Height->RenderPitchAlignment < 0x41) {
        local_bc = 0x40;
      }
      else {
        local_bc = _Height->RenderPitchAlignment;
      }
      _Height->RenderPitchAlignment = local_bc;
    }
    if ((((pRestrictions_local->PitchAlignment == 0x14f) ||
         (pRestrictions_local->PitchAlignment == 0x150)) ||
        (pRestrictions_local->PitchAlignment == 0x15c)) ||
       ((pRestrictions_local->PitchAlignment == 0x174 ||
        (pRestrictions_local->PitchAlignment == 0x175)))) {
      sVar23 = 2;
      if (pRestrictions_local->PitchAlignment != 0x175) {
        sVar23 = 1;
      }
      _Height->LockPitchAlignment = _Height->LockPitchAlignment << sVar23;
      _Height->MinPitch = _Height->MinPitch << sVar23;
      _Height->PitchAlignment = _Height->PitchAlignment << sVar23;
      _Height->RenderPitchAlignment = _Height->RenderPitchAlignment << sVar23;
    }
    GStack_3c = Status;
    GmmTextureCalc::FindMipTailStartLod
              ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local);
    pWVar29 = Context::GetWaTable((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                                  super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                                  super_GmmTextureCalc.pGmmLibContext);
    if ((((*(ulong *)&pWVar29->field_0x4 >> 0x2c & 1) != 0) &&
        (bVar24 = GmmIsYUVFormatLCUAligned(pRestrictions_local->PitchAlignment), bVar24)) &&
       (Status != GMM_SUCCESS)) {
      GStack_3c = (Status + 0x3f) - (Status + 0x3f & 0x3f);
      VHeight = (GStack_3c - Status) + VHeight;
    }
    if ((pGVar28->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalSize == 0) ||
       (uVar13._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar13._4_4_ = pRestrictions_local->MinPitch, (uVar13 >> 0x29 & 1) != 0)) {
      uVar15._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar15._4_4_ = pRestrictions_local->MinPitch;
      if ((uVar15 >> 0x29 & 1) != 0) {
        pGVar30 = Context::GetPlatformInfo
                            ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                             super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc
                             .pGmmLibContext);
        uVar1 = pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight;
        if ((pRestrictions_local->PitchAlignment == 0x152) ||
           (pRestrictions_local->PitchAlignment == 0x154)) {
          if (*(int *)((long)&pRestrictions_local[4].MinWidth + 4) + 0xdU < 8) {
            local_dc = *(int *)((long)&pRestrictions_local[4].MinWidth + 4) + 0xd;
          }
          else {
            if (*(int *)((long)&pRestrictions_local[4].MinWidth + 4) + 0x12U < 0xc) {
              local_e0 = 0;
            }
            else {
              local_e0 = *(int *)((long)&pRestrictions_local[4].MinWidth + 4) + 0x12;
            }
            local_dc = local_e0;
          }
          uVar25 = pGVar28->TileInfo[local_dc].LogicalTileWidth;
          YHeight = (YHeight + uVar25 * 2 + -1) - (YHeight + uVar25 * 2 + -1 & uVar25 * 2 - 1);
        }
        uVar16._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar16._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar16 >> 6 & 1) == 0) &&
           (uVar17._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar17._4_4_ = pRestrictions_local->MinPitch, (uVar17 >> 0x1d & 1) == 0)) {
          local_ec = 1;
        }
        else {
          local_ec = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
        }
        YHeight = GmmTextureCalc::ExpandWidth
                            ((GmmTextureCalc *)this,
                             YHeight / (pRestrictions_local->RenderPitchAlignment >> 3),
                             pRestrictions_local->MaxDepth,local_ec);
        YHeight = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                    super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                    _vptr_GmmTextureCalc[0x16])(this,pRestrictions_local,(ulong)YHeight);
        uVar18._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar18._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar18 >> 6 & 1) == 0) &&
           (uVar19._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar19._4_4_ = pRestrictions_local->MinPitch, (uVar19 >> 0x1d & 1) == 0)) {
          local_f8 = 1;
        }
        else {
          local_f8 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
        }
        uVar25 = GmmTextureCalc::ExpandHeight
                           ((GmmTextureCalc *)this,AdjustedVHeight,pRestrictions_local->MaxArraySize
                            ,local_f8);
        iVar26 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                   super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                   _vptr_GmmTextureCalc[0x17])(this,pRestrictions_local,(ulong)uVar25);
        uVar20._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar20._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar20 >> 6 & 1) == 0) &&
           (uVar21._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar21._4_4_ = pRestrictions_local->MinPitch, (uVar21 >> 0x1d & 1) == 0)) {
          local_104 = 1;
        }
        else {
          local_104 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
        }
        uVar25 = GmmTextureCalc::ExpandHeight
                           ((GmmTextureCalc *)this,Status,pRestrictions_local->MaxArraySize,
                            local_104);
        iVar27 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                   super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                   _vptr_GmmTextureCalc[0x17])(this,pRestrictions_local,(ulong)uVar25);
        VHeight = ((iVar26 + uVar1 * 2) - (iVar26 + (uVar1 - 1) & uVar1 - 1)) +
                  ((iVar27 + -2) - (iVar27 + (uVar1 - 1) & uVar1 - 1));
      }
    }
    else {
      pGVar30 = Context::GetPlatformInfo
                          ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                           super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                           pGmmLibContext);
      TileCols = pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight;
      pGVar30 = Context::GetPlatformInfo
                          ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                           super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                           pGmmLibContext);
      uVar2 = pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth;
      *(undefined1 *)((long)&pRestrictions_local[4].MaxPitch + 4) = 1;
      uVar14._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar14._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar14 >> 1 & 1) != 0) &&
         (pSVar31 = Context::GetSkuTable
                              ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                               super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                               super_GmmTextureCalc.pGmmLibContext),
         ((ulong)pSVar31->field_1 >> 0x19 & 1) == 0)) {
        if (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0) &&
           ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) == 0)) {
          pWVar29 = Context::GetWaTable((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                                        super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                                        super_GmmTextureCalc.pGmmLibContext);
          if ((*(ulong *)&pWVar29->field_0x4 >> 0x2e & 1) == 0) {
            pWVar29 = Context::GetWaTable((this->super_GmmGen12TextureCalc).
                                          super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
                                          super_GmmGen9TextureCalc.super_GmmTextureCalc.
                                          pGmmLibContext);
            local_c4 = 0x40;
            if (((uint)((ulong)*(undefined8 *)&pWVar29->field_0x4 >> 0x2f) & 1) != 0) {
              local_c4 = 4;
            }
          }
          else {
            local_c4 = 1;
          }
        }
        else {
          pWVar29 = Context::GetWaTable((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                                        super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                                        super_GmmTextureCalc.pGmmLibContext);
          bVar24 = false;
          if (((uint)((ulong)*(undefined8 *)&pWVar29->field_0x4 >> 0x2f) & 1) == 0) {
            pWVar29 = Context::GetWaTable((this->super_GmmGen12TextureCalc).
                                          super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
                                          super_GmmGen9TextureCalc.super_GmmTextureCalc.
                                          pGmmLibContext);
            bVar24 = (*(ulong *)&pWVar29->field_0x4 >> 0x2e & 1) == 0;
          }
          local_c4 = 1;
          if (bVar24) {
            local_c4 = 0x10;
          }
        }
        TileCols = local_c4 * TileCols;
      }
      if ((pRestrictions_local->PitchAlignment == 0x152) ||
         (pRestrictions_local->PitchAlignment == 0x154)) {
        if (uVar2 == 0) {
          local_c8 = YHeight;
        }
        else {
          local_c8 = (YHeight + (uVar2 - 1)) / uVar2;
        }
        if ((local_c8 & 1) != 0) {
          YHeight = (local_c8 + 1) * uVar2;
        }
      }
      if (bVar22) {
        local_d0 = (GStack_3c + (TileCols - 1)) - (GStack_3c + (TileCols - 1) & TileCols - 1);
      }
      else {
        local_d0 = ((Status + TileCols * 2) - (Status + (TileCols - 1) & TileCols - 1)) +
                   ((GStack_3c - GMM_INVALIDPARAM) - (GStack_3c + (TileCols - 1) & TileCols - 1));
      }
      VHeight = ((AdjustedVHeight + (TileCols - 1)) -
                (AdjustedVHeight + (TileCols - 1) & TileCols - 1)) + local_d0;
      if ((((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0) ||
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x2c & 1) != 0)) ||
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0)) {
        *(ulong *)&pRestrictions_local->field_0x14 =
             *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffffefffffff | 0x10000000;
      }
    }
    if ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x1c & 1) != 0) {
      GmmTextureCalc::RedescribeTexturePlanes
                ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local,&YHeight);
    }
    BitsPerPixel = GmmTextureCalc::FillTexPitchAndSize
                             ((GmmTextureCalc *)this,(GMM_TEXTURE_INFO *)pRestrictions_local,
                              (ulong)YHeight,VHeight,_Height);
    if (BitsPerPixel == GMM_SUCCESS) {
      (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
        super_GmmGen9TextureCalc.super_GmmTextureCalc._vptr_GmmTextureCalc[0x28])
                (this,pRestrictions_local);
    }
    if (1 < *(uint *)((long)&pRestrictions_local->MinWidth + 4)) {
      GVar3 = pRestrictions_local[2].MaxHeight;
      GVar32 = GVar3 * *(uint *)((long)&pRestrictions_local->MinWidth + 4);
      if (GVar32 - pGVar28->SurfaceMaxSize == 0 || (long)GVar32 < pGVar28->SurfaceMaxSize) {
        pRestrictions_local[3].Alignment = (int)GVar3;
        pRestrictions_local[3].PitchAlignment = (int)(GVar3 >> 0x20);
        pRestrictions_local[2].MaxHeight = GVar32;
      }
      else {
        BitsPerPixel = 1;
      }
    }
    this_local._4_4_ = BitsPerPixel;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmXe_LPGTextureCalc::FillTexPlanar(GMM_TEXTURE_INFO * pTexInfo,
                                                                   __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   WidthBytesPhysical, Height, YHeight, VHeight;
    uint32_t   AdjustedVHeight = 0;
    GMM_STATUS Status;
    bool       UVPacked = false;
    uint32_t   BitsPerPixel, AlignedWidth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(!pTexInfo->Flags.Info.TiledW);
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    AlignedWidth = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    if(!pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        pTexInfo->TileMode = TILE_NONE;
    }
    else
    {
        pTexInfo->TileMode = LEGACY_TILE_Y;
    }

    WidthBytesPhysical = AlignedWidth * BitsPerPixel >> 3;
    Height = VHeight = 0;

    YHeight = pTexInfo->BaseHeight;

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1: // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420: // Same as IMC3.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UUUU
        // UUUU
        // VVVV
        // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height                                      = YHeight + 2 * VHeight; // One VHeight for V and one for U.
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
            //YYYYYYYY
            //YYYYYYYY
            //YYYYYYYY
            //YYYYYYYY
            //UUUUUUUU
            //VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411: // Similar to IMC3 but U/V are quarter width and full height.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UU
        // UU
        // UU
        // UU
        // VV
        // VV
        // VV
        // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UUUU
        // UUUU
        // UUUU
        // UUUU
        // VVVV
        // VVVV
        // VVVV
        // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
#if _WIN32
        case GMM_FORMAT_WGBOX_YUV444:
        case GMM_FORMAT_WGBOX_PLANAR_YUV444:
#endif
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        {
            //For RGBP linear Tile keep resource Offset non aligned and for other Tile format to be 16-bit aligned
            if(pTexInfo->Flags.Info.Linear)
            {
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
            }
            else
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
            }
            break;
        }
        case GMM_FORMAT_IMC2: // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            VHeight = GFX_CEIL_DIV(YHeight, 2);

            WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.

            Height = YHeight + VHeight;

            // With SURFACE_STATE.XOffset support, the U-V interface has
            // much lighter restrictions--which will be naturally met by
            // surface pitch restrictions (i.e. dividing an IMC2/4 pitch
            // by 2--to get the U/V interface--will always produce a safe
            // XOffset value).
            // Not technically UV packed but sizing works out the same
            // if the resource is std swizzled
            UVPacked                                    = true;
            pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 2;
            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(YHeight, 2); // U/V plane half of Y
                Height  = YHeight + VHeight;
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
                Height  = YHeight + VHeight;
            }

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016) ||
               (pTexInfo->Format == GMM_FORMAT_P208) ||
               (pTexInfo->Format == GMM_FORMAT_P216))
            {
                WidthBytesPhysical                          = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 2;
            }
            else //if(pTexInfo->Format == GMM_FORMAT_NV11)
            {
                // Tiling not supported, since YPitch != UVPitch...
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.Linear  = 1;
                GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
                GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            }

            UVPacked = true;
            break;
        }
        case GMM_FORMAT_I420: // IYUV & I420: are identical to YV12 except,
        case GMM_FORMAT_IYUV: // U & V pl.s are reversed.
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, UVSize, YVSizeRShift;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = WidthBytesPhysical * YHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(WidthBytesPhysical, YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(YHeight, YSizeForUVPurposesDimensionalAlignment);

            UVSize = 2 * // <-- U + V
                     (YSizeForUVPurposes >> YVSizeRShift);

            Height = GFX_CEIL_DIV(YSize + UVSize, WidthBytesPhysical);

            // Tiling not supported, since YPitch != UVPitch...
            pTexInfo->Flags.Info.TiledYf                = 0;
            pTexInfo->Flags.Info.TiledX                 = 0;
            pTexInfo->Flags.Info.Linear                 = 1;
            pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 1;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unexpected format");
            return GMM_ERROR;
        }
    }

    // Align Height to even row to avoid hang if HW over-fetch
    Height = GFX_ALIGN(Height, __GMM_EVEN_ROW);

    SetTileMode(pTexInfo);

    // If the Surface has Odd height dimension, we will fall back to Linear Format.
    // If MMC is enabled, disable MMC during such cases.
    if(pTexInfo->Flags.Gpu.MMC)
    {
        if(!(GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags)))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }

    // If the Surface has Odd height dimension, we will fall back to Linear Format.
    // If MMC is enabled, disable .CCS/UnifiedAuxSurface during such cases.
    if(pTexInfo->Flags.Gpu.CCS)
    {
        if(!(GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
           !(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs && GMM_IS_4KB_TILE(pTexInfo->Flags)))
        {
            pTexInfo->Flags.Gpu.MMC               = 0;
            pTexInfo->Flags.Gpu.CCS               = 0;
            pTexInfo->Flags.Gpu.UnifiedAuxSurface = 0;
            pTexInfo->Flags.Gpu.__NonMsaaTileYCcs = 0;
        }
    }

    // Legacy Planar "Linear Video" Restrictions...
    if(pTexInfo->Flags.Info.Linear && !pTexInfo->Flags.Wa.NoLegacyPlanarLinearVideoRestrictions)
    {
        pRestrictions->LockPitchAlignment   = GFX_MAX(pRestrictions->LockPitchAlignment, GMM_BYTES(64));
        pRestrictions->MinPitch             = GFX_MAX(pRestrictions->MinPitch, GMM_BYTES(64));
        pRestrictions->PitchAlignment       = GFX_MAX(pRestrictions->PitchAlignment, GMM_BYTES(64));
        pRestrictions->RenderPitchAlignment = GFX_MAX(pRestrictions->RenderPitchAlignment, GMM_BYTES(64));
    }

    // Multiply overall pitch alignment for surfaces whose U/V planes have a
    // pitch down-scaled from that of Y--Since the U/V pitches must meet the
    // original restriction, the Y pitch must meet a scaled-up multiple.
    if((pTexInfo->Format == GMM_FORMAT_I420) ||
       (pTexInfo->Format == GMM_FORMAT_IYUV) ||
       (pTexInfo->Format == GMM_FORMAT_NV11) ||
       (pTexInfo->Format == GMM_FORMAT_YV12) ||
       (pTexInfo->Format == GMM_FORMAT_YVU9))
    {
        uint32_t LShift =
        (pTexInfo->Format != GMM_FORMAT_YVU9) ?
        1 : // UVPitch = 1/2 YPitch
        2;  // UVPitch = 1/4 YPitch

        pRestrictions->LockPitchAlignment <<= LShift;
        pRestrictions->MinPitch <<= LShift;
        pRestrictions->PitchAlignment <<= LShift;
        pRestrictions->RenderPitchAlignment <<= LShift;
    }

    AdjustedVHeight = VHeight;

    FindMipTailStartLod(pTexInfo);

    // In case of Planar surfaces, only the last Plane has to be aligned to 64 for LCU access
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU && GmmIsYUVFormatLCUAligned(pTexInfo->Format) && VHeight > 0)
    {
        AdjustedVHeight = GFX_ALIGN(VHeight, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
        Height += AdjustedVHeight - VHeight;
    }

    // For std swizzled and UV packed tile Ys/Yf cases, the planes
    // must be tile-boundary aligned. Actual alignment is handled
    // in FillPlanarOffsetAddress, but height and width must
    // be adjusted for correct size calculation
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]) &&
       !pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        uint32_t TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        pTexInfo->OffsetInfo.PlaneXe_LPG.IsTileAlignedPlanes = true;

        if(pTexInfo->Flags.Gpu.CCS && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) // alignment adjustment needed only for aux tables
        {
            if(GMM_IS_64KB_TILE(pTexInfo->Flags))
            {
                TileHeight *= (!WA64K(pGmmLibContext) && !WA16K(pGmmLibContext)) ? 16 : 1; // For 64Kb Tile mode: Multiply TileHeight by 16 for 1 MB alignment
            }
            else
            {
                TileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 64); // For 4k Tile:  Multiply TileHeight by 4 and Pitch by 4 for 64kb alignment, multiply TileHeight by 64 and Pitch by 4 for 1 MB alignment
            }
        }

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
            // If the U & V planes are side-by-side then the surface pitch must be
            // padded out so that U and V planes will being on a tile boundary.
            // This means that an odd Y plane width must be padded out
            // with an additional tile. Even widths do not need padding
            uint32_t TileCols = GFX_CEIL_DIV(WidthBytesPhysical, TileWidth);
            if(TileCols % 2)
            {
                WidthBytesPhysical = (TileCols + 1) * TileWidth;
            }
        }

        Height = GFX_ALIGN(YHeight, TileHeight) + (UVPacked ? GFX_ALIGN(AdjustedVHeight, TileHeight) :
                                                              (GFX_ALIGN(VHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight)));

        if(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf)
        {
            pTexInfo->Flags.Info.RedecribedPlanes = true;
        }
    }
    else if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;

        BitsPerPixel = 8;

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
// If the U & V planes are side-by-side then the surface pitch must be
// padded out so that U and V planes will being on a tile boundary.
// This means that an odd Y plane width must be padded out
// with an additional tile. Even widths do not need padding

// CCS must use padded main surface width, so get main surface TileWidth
#define CCSMODE_TO_TILEMODE(y) ((y + TILE_YF_2D_8bpe) < TILE_YS_1D_8bpe) ? (y + TILE_YF_2D_8bpe) : \
                                                                           ((y + TILE_YF_2D_8bpe + 5) >= TILE_YS_1D_128bpe) ? (y + TILE_YF_2D_8bpe + 5) : TILE_NONE

            uint32_t BaseTileWidth = pPlatform->TileInfo[CCSMODE_TO_TILEMODE(pTexInfo->CCSModeAlign)].LogicalTileWidth;
            WidthBytesPhysical     = GFX_ALIGN(WidthBytesPhysical, 2 * BaseTileWidth);
        }

        AlignedWidth = GFX_ULONG_CAST(WidthBytesPhysical / (pTexInfo->BitsPerPixel >> 3));

        WidthBytesPhysical = __GMM_EXPAND_WIDTH(this, AlignedWidth, pTexInfo->Alignment.HAlign, pTexInfo);
        WidthBytesPhysical = ScaleTextureWidth(pTexInfo, WidthBytesPhysical); //Should both YAux and UVAux use same CCModeALign (ie using common bpe?)
                                                                              //If different, then copy Aux info from per-plane Aux? HW has separate bpe or common?
        YHeight = __GMM_EXPAND_HEIGHT(this, YHeight, pTexInfo->Alignment.VAlign, pTexInfo);
        YHeight = ScaleTextureHeight(pTexInfo, YHeight);
        YHeight = GFX_ALIGN(YHeight, TileHeight);

        VHeight = __GMM_EXPAND_HEIGHT(this, VHeight, pTexInfo->Alignment.VAlign, pTexInfo);
        VHeight = ScaleTextureHeight(pTexInfo, VHeight);
        VHeight = GFX_ALIGN(VHeight, TileHeight);

        Height = YHeight + VHeight;
    }

    if(pTexInfo->Flags.Info.RedecribedPlanes)
    {
        if(false == RedescribeTexturePlanes(pTexInfo, &WidthBytesPhysical))
        {
            __GMM_ASSERT(false);
        }
    }
    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Height, pRestrictions)) == GMM_SUCCESS)
    {
        FillPlanarOffsetAddress(pTexInfo);
    }

    // Planar & hybrid 2D arrays supported in DX11.1+ spec but not HW. Memory layout
    // is defined by SW requirements; Y plane must be 4KB aligned.
    if(pTexInfo->ArraySize > 1)
    {
        GMM_GFX_SIZE_T ElementSizeBytes = pTexInfo->Size;
        int64_t        LargeSize;

        // Size should always be page aligned.
        __GMM_ASSERT((pTexInfo->Size % PAGE_SIZE) == 0);

        if((LargeSize = (int64_t)ElementSizeBytes * pTexInfo->ArraySize) <= pPlatform->SurfaceMaxSize)
        {
            pTexInfo->OffsetInfo.PlaneXe_LPG.ArrayQPitch = ElementSizeBytes;
            pTexInfo->Size                               = LargeSize;
        }
        else
        {
            GMM_ASSERTDPF(0, "Surface too large!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return (Status);
}